

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O0

void Abc_NtkSharePrint(Abc_ShaMan_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  void *__ptr;
  void *__ptr_00;
  Vec_Ptr_t *pVVar5;
  Vec_Int_t *p_00;
  uint local_44;
  int nTotal;
  int *pCounters;
  char *pBuffer;
  int ObjId;
  int j;
  int k;
  int i;
  Vec_Int_t *vInput;
  Vec_Ptr_t *vBucket;
  Abc_ShaMan_t *p_local;
  
  iVar1 = Vec_IntSize(p->vObj2Lit);
  __ptr = malloc((long)(iVar1 + 1));
  iVar1 = Vec_IntSize(p->vObj2Lit);
  __ptr_00 = calloc((long)(iVar1 + 1),4);
  j = 0;
  do {
    iVar1 = Vec_PtrSize(p->vBuckets);
    if (iVar1 <= j) {
      for (j = 0; iVar1 = Vec_IntSize(p->vObj2Lit), j < iVar1; j = j + 1) {
        if (0 < *(int *)((long)__ptr_00 + (long)j * 4)) {
          printf("%d=%d ",(ulong)(uint)j,(ulong)*(uint *)((long)__ptr_00 + (long)j * 4));
        }
      }
      printf("\n");
      local_44 = 0;
      for (j = 0; j < p->nStartCols; j = j + 1) {
        local_44 = *(int *)((long)__ptr_00 + (long)j * 4) + -1 + local_44;
      }
      printf("Total = %d.  ",(ulong)local_44);
      iVar1 = Vec_IntSize(p->vObj2Lit);
      printf("Gates = %d.\n",(ulong)((iVar1 - p->nStartCols) + local_44));
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
      }
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      printf("Bucket contents: ");
      for (j = 0; iVar1 = Vec_PtrSize(p->vBuckets), j < iVar1; j = j + 1) {
        pVVar5 = (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets,j);
        uVar4 = Vec_PtrSize(pVVar5);
        printf("%d ",(ulong)uVar4);
      }
      printf("\n");
      return;
    }
    pVVar5 = (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets,j);
    for (pBuffer._4_4_ = 0; iVar1 = Vec_PtrSize(pVVar5), pBuffer._4_4_ < iVar1;
        pBuffer._4_4_ = pBuffer._4_4_ + 1) {
      p_00 = (Vec_Int_t *)Vec_PtrEntry(pVVar5,pBuffer._4_4_);
      for (ObjId = 0; iVar1 = Vec_IntSize(p->vObj2Lit), ObjId < iVar1; ObjId = ObjId + 1) {
        *(undefined1 *)((long)__ptr + (long)ObjId) = 0x30;
      }
      *(undefined1 *)((long)__ptr + (long)ObjId) = 0;
      for (ObjId = 2; iVar1 = Vec_IntSize(p_00), ObjId < iVar1; ObjId = ObjId + 1) {
        iVar1 = Vec_IntEntry(p_00,ObjId);
        iVar2 = Vec_IntSize(p->vObj2Lit);
        if (iVar2 <= iVar1) {
          __assert_fail("ObjId < Vec_IntSize(p->vObj2Lit)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                        ,0x180,"void Abc_NtkSharePrint(Abc_ShaMan_t *)");
        }
        *(undefined1 *)((long)__ptr + (long)iVar1) = 0x31;
        *(int *)((long)__ptr_00 + (long)iVar1 * 4) = *(int *)((long)__ptr_00 + (long)iVar1 * 4) + 1;
      }
      uVar4 = Vec_IntEntry(p_00,0);
      uVar3 = Vec_IntEntry(p_00,1);
      printf("%4d%3d: %s\n",(ulong)uVar4,(ulong)uVar3,__ptr);
    }
    j = j + 1;
  } while( true );
}

Assistant:

void Abc_NtkSharePrint( Abc_ShaMan_t * p )
{
    Vec_Ptr_t * vBucket;
    Vec_Int_t * vInput;
    int i, k, j, ObjId;
    char * pBuffer = ABC_ALLOC( char, Vec_IntSize(p->vObj2Lit) + 1 );
    int * pCounters = ABC_CALLOC( int, Vec_IntSize(p->vObj2Lit) + 1 );
    int nTotal = 0;
    Vec_PtrForEachEntry( Vec_Ptr_t *, p->vBuckets, vBucket, i )
    Vec_PtrForEachEntry( Vec_Int_t *, vBucket, vInput, j )
    {
        for ( k = 0; k < Vec_IntSize(p->vObj2Lit); k++ )
            pBuffer[k] = '0';
        pBuffer[k] = 0;

        Vec_IntForEachEntryStart( vInput, ObjId, k, SHARE_NUM )
        {
            assert( ObjId < Vec_IntSize(p->vObj2Lit) );
            pBuffer[ObjId] = '1';
            pCounters[ObjId]++;
        }
        printf( "%4d%3d: %s\n", Vec_IntEntry(vInput, 0), Vec_IntEntry(vInput, 1), pBuffer );
    }

    for ( i = 0; i < Vec_IntSize(p->vObj2Lit); i++ )
        if ( pCounters[i] > 0 )
            printf( "%d=%d ", i, pCounters[i] ); 
    printf( "\n" );

    nTotal = 0;
    for ( i = 0; i < p->nStartCols; i++ )
        nTotal += pCounters[i] - 1;
    printf( "Total = %d.  ", nTotal );
    printf( "Gates = %d.\n", Vec_IntSize(p->vObj2Lit) - p->nStartCols + nTotal );

    ABC_FREE( pCounters );
    ABC_FREE( pBuffer );

    printf( "Bucket contents: " );
    Vec_PtrForEachEntry( Vec_Ptr_t *, p->vBuckets, vBucket, i )
        printf( "%d ", Vec_PtrSize(vBucket) );
    printf( "\n" );
}